

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_device_read__alsa
                    (ma_device *pDevice,void *pFramesOut,ma_uint32 frameCount,ma_uint32 *pFramesRead
                    )

{
  int iVar1;
  ma_result mVar2;
  long lVar3;
  ma_result resultCode;
  ma_uint32 *pmVar4;
  char *message;
  
  if (pFramesOut == (void *)0x0) {
    __assert_fail("pFramesOut != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x453f,
                  "ma_result ma_device_read__alsa(ma_device *, void *, ma_uint32, ma_uint32 *)");
  }
  if (pFramesRead != (ma_uint32 *)0x0) {
    *pFramesRead = 0;
  }
  pmVar4 = pFramesRead;
  do {
    do {
      lVar3 = (*(pDevice->pContext->field_21).alsa.snd_pcm_readi)
                        ((pDevice->field_23).alsa.pPCMCapture,pFramesOut,(ulong)frameCount);
      if (-1 < lVar3) {
        if (pFramesRead != (ma_uint32 *)0x0) {
          *pFramesRead = (ma_uint32)lVar3;
        }
        return 0;
      }
    } while (lVar3 != -0x20);
    iVar1 = (*(pDevice->pContext->field_21).alsa.snd_pcm_recover)
                      ((pDevice->field_23).alsa.pPCMCapture,0xffffffe0,1);
    resultCode = (ma_result)pmVar4;
    if (iVar1 < 0) {
      mVar2 = ma_result_from_errno(-iVar1);
      message = "[ALSA] Failed to recover device after overrun.";
      goto LAB_00107d92;
    }
    iVar1 = (*(pDevice->pContext->field_21).alsa.snd_pcm_start)
                      ((pDevice->field_23).alsa.pPCMCapture);
    resultCode = (ma_result)pmVar4;
    if (iVar1 < 0) {
      mVar2 = ma_result_from_errno(-iVar1);
      message = "[ALSA] Failed to start device after underrun.";
      goto LAB_00107d92;
    }
    lVar3 = (*(pDevice->pContext->field_21).alsa.snd_pcm_readi)
                      ((pDevice->field_23).alsa.pPCMCapture,pFramesOut,(ulong)frameCount);
    resultCode = (ma_result)pmVar4;
  } while (-1 < lVar3);
  mVar2 = ma_result_from_errno(-(int)lVar3);
  message = "[ALSA] Failed to read data from the internal device.";
LAB_00107d92:
  ma_post_error(pDevice,1,message,resultCode);
  return mVar2;
}

Assistant:

static ma_result ma_device_read__alsa(ma_device* pDevice, void* pFramesOut, ma_uint32 frameCount, ma_uint32* pFramesRead)
{
    ma_snd_pcm_sframes_t resultALSA;

    MA_ASSERT(pDevice != NULL);
    MA_ASSERT(pFramesOut != NULL);

    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    for (;;) {
        resultALSA = ((ma_snd_pcm_readi_proc)pDevice->pContext->alsa.snd_pcm_readi)((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture, pFramesOut, frameCount);
        if (resultALSA >= 0) {
            break;  /* Success. */
        } else {
            if (resultALSA == -EAGAIN) {
                /*printf("TRACE: EGAIN (read)\n");*/
                continue;   /* Try again. */
            } else if (resultALSA == -EPIPE) {
            #if defined(MA_DEBUG_OUTPUT)
                printf("TRACE: EPIPE (read)\n");
            #endif

                /* Overrun. Recover and try again. If this fails we need to return an error. */
                resultALSA = ((ma_snd_pcm_recover_proc)pDevice->pContext->alsa.snd_pcm_recover)((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture, resultALSA, MA_TRUE);
                if (resultALSA < 0) {
                    return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[ALSA] Failed to recover device after overrun.", ma_result_from_errno((int)-resultALSA));
                }

                resultALSA = ((ma_snd_pcm_start_proc)pDevice->pContext->alsa.snd_pcm_start)((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture);
                if (resultALSA < 0) {
                    return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[ALSA] Failed to start device after underrun.", ma_result_from_errno((int)-resultALSA));
                }

                resultALSA = ((ma_snd_pcm_readi_proc)pDevice->pContext->alsa.snd_pcm_readi)((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture, pFramesOut, frameCount);
                if (resultALSA < 0) {
                    return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[ALSA] Failed to read data from the internal device.", ma_result_from_errno((int)-resultALSA));
                }
            }
        }
    }

    if (pFramesRead != NULL) {
        *pFramesRead = resultALSA;
    }

    return MA_SUCCESS;
}